

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHeader.cpp
# Opt level: O2

void testHeader(string *tempDir)

{
  ostream *poVar1;
  Test<Imf_3_4::Header> headerTest;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"displayWindow",&local_31);
  Test<Imf_3_4::Header>::testFind(&headerTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"displayWindow",&local_31);
  Test<Imf_3_4::Header>::testSubscript(&headerTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"displayWindow",&local_31);
  Test<Imf_3_4::Header>::testIterators(&headerTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"displayWindow",&local_31);
  Test<const_Imf_3_4::Header>::testFind((Test<const_Imf_3_4::Header> *)&headerTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"displayWindow",&local_31);
  Test<const_Imf_3_4::Header>::testSubscript((Test<const_Imf_3_4::Header> *)&headerTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"displayWindow",&local_31);
  Test<const_Imf_3_4::Header>::testIterators((Test<const_Imf_3_4::Header> *)&headerTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"displayWindow",(allocator<char> *)&headerTest);
  testEraseAttribute(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  testEraseAttributeThrowsWithEmptyString();
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void
testHeader (const string& tempDir)
{
    try
    {
        {
            Test<Header> headerTest;
            headerTest.testFind ("displayWindow");
            headerTest.testSubscript ("displayWindow");
            headerTest.testIterators ("displayWindow");
        }
        {
            Test<const Header> headerTest;
            headerTest.testFind ("displayWindow");
            headerTest.testSubscript ("displayWindow");
            headerTest.testIterators ("displayWindow");
        }
        testEraseAttribute ("displayWindow");
        testEraseAttributeThrowsWithEmptyString ();
        cout << "ok\n" << endl;
    }
    catch (const exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}